

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

QString * defaultLibexecDir(void)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  qsizetype qVar5;
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  undefined8 local_38;
  undefined8 uStack_30;
  qsizetype local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QVar6.m_data = (storage_type_conflict *)0x7;
  QVar6.m_size = (qsizetype)&local_38;
  QString::fromLatin1(QVar6);
  qVar5 = local_28;
  uVar1 = (undefined4)local_38;
  uVar2 = local_38._4_4_;
  uVar3 = (undefined4)uStack_30;
  uVar4 = uStack_30._4_4_;
  local_38 = 0;
  uStack_30 = 0;
  *(undefined4 *)&(in_RDI->d).d = uVar1;
  *(undefined4 *)((long)&(in_RDI->d).d + 4) = uVar2;
  *(undefined4 *)&(in_RDI->d).ptr = uVar3;
  *(undefined4 *)((long)&(in_RDI->d).ptr + 4) = uVar4;
  local_28 = 0;
  (in_RDI->d).size = qVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString defaultLibexecDir()
{
#ifdef Q_OS_WIN32
    return "bin"_L1;
#else
    return "libexec"_L1;
#endif
}